

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::
GeometryShaderMaxOutputComponentsSinglePointTest
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  TestCaseBase::TestCaseBase((TestCaseBase *)this,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).m_fragment_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_geometry_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_program_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_framebuffer_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_color_texture_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_array_object_id = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_fragment_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_geometry_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_vertex_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_fragment_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_geometry_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_n_vertex_shader_parts = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_format = 0x8058;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_height = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_pixel_size = 0;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_read_format = 0x1908;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_read_type = 0x1401;
  (this->super_GeometryShaderLimitsRenderingBase).m_texture_width = 0;
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxOutputComponentsSinglePointTest_02156f60;
  (this->m_fragment_shader_code)._M_dataplus._M_p = (pointer)&(this->m_fragment_shader_code).field_2
  ;
  (this->m_fragment_shader_code)._M_string_length = 0;
  (this->m_fragment_shader_code).field_2._M_local_buf[0] = '\0';
  (this->m_geometry_shader_code)._M_dataplus._M_p = (pointer)&(this->m_geometry_shader_code).field_2
  ;
  (this->m_geometry_shader_code)._M_string_length = 0;
  (this->m_geometry_shader_code).field_2._M_local_buf[0] = '\0';
  this->m_max_output_components = 0;
  this->m_max_output_vectors = 0;
  this->m_n_available_vectors = 0;
  return;
}

Assistant:

GeometryShaderMaxOutputComponentsSinglePointTest::GeometryShaderMaxOutputComponentsSinglePointTest(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_max_output_components(0)
	, m_max_output_vectors(0)
	, m_n_available_vectors(0)
{
	/* Nothing to be done here */
}